

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drop_unknown_fields_test.cc
# Opt level: O0

void __thiscall
google::protobuf::DropUnknownFieldsTest_GeneratedMessage_Test::
~DropUnknownFieldsTest_GeneratedMessage_Test(DropUnknownFieldsTest_GeneratedMessage_Test *this)

{
  DropUnknownFieldsTest_GeneratedMessage_Test *this_local;
  
  ~DropUnknownFieldsTest_GeneratedMessage_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DropUnknownFieldsTest, GeneratedMessage) {
  FooWithExtraFields foo_with_extra_fields;
  foo_with_extra_fields.set_int32_value(1);
  foo_with_extra_fields.set_enum_value(FooWithExtraFields::MOO);
  foo_with_extra_fields.set_extra_int32_value(2);

  Foo foo;
  ASSERT_TRUE(foo.ParseFromString(foo_with_extra_fields.SerializeAsString()));
  EXPECT_EQ(1, foo.int32_value());
  EXPECT_EQ(static_cast<int>(FooWithExtraFields::MOO),
            static_cast<int>(foo.enum_value()));
  EXPECT_FALSE(foo.GetReflection()->GetUnknownFields(foo).empty());

  ASSERT_TRUE(foo_with_extra_fields.ParseFromString(foo.SerializeAsString()));
  EXPECT_EQ(1, foo_with_extra_fields.int32_value());
  EXPECT_EQ(FooWithExtraFields::MOO, foo_with_extra_fields.enum_value());
  // The "extra_int32_value" field should not be lost.
  EXPECT_EQ(2, foo_with_extra_fields.extra_int32_value());
}